

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O1

void do_variadic(void)

{
  bool bVar1;
  char *__end;
  int local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_68[1] = 5;
  local_68[0] = 5;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"a","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"a","");
  bVar1 = pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
                    (local_68 + 1,local_68,2.0,2.0,&local_40,&local_60);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("pairwise_equal(5, 5, 2.0, 2.0, std::string(\"a\"), std::string(\"a\"))",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/cxx11.cc",
                0xb0,"void do_variadic()");
}

Assistant:

void
do_variadic()
{
    variadic(15, 15);
    variadic(12);
    assert(pairwise_equal(5, 5, 2.0, 2.0, std::string("a"), std::string("a")));
    assert(!pairwise_equal(5, 5, 2.0, 3.0));
}